

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O1

void duckdb::BinaryExecutor::
     ExecuteFlatLoop<duckdb::string_t,duckdb::string_t,bool,duckdb::BinarySingleArgumentOperatorWrapper,duckdb::GreaterThan,bool,false,false>
               (string_t *ldata,string_t *rdata,bool *result_data,idx_t count,ValidityMask *mask,
               bool fun)

{
  undefined8 *puVar1;
  unsigned_long *puVar2;
  bool bVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  unsigned_long uVar10;
  idx_t iVar11;
  ulong uVar12;
  anon_union_16_2_67f50693_for_value local_60;
  anon_union_16_2_67f50693_for_value local_50;
  ulong local_40;
  ValidityMask *local_38;
  
  local_38 = mask;
  if ((mask->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0) {
    if (count != 0) {
      lVar6 = 8;
      iVar11 = 0;
      do {
        puVar1 = (undefined8 *)((long)ldata + lVar6 + -8);
        local_50._0_8_ = *puVar1;
        local_50.pointer.ptr = (char *)puVar1[1];
        puVar1 = (undefined8 *)((long)rdata + lVar6 + -8);
        local_60._0_8_ = *puVar1;
        local_60.pointer.ptr = (char *)puVar1[1];
        bVar3 = string_t::StringComparisonOperators::GreaterThan
                          ((string_t *)&local_50.pointer,(string_t *)&local_60.pointer);
        result_data[iVar11] = bVar3;
        iVar11 = iVar11 + 1;
        lVar6 = lVar6 + 0x10;
      } while (count != iVar11);
    }
  }
  else if (0x3f < count + 0x3f) {
    uVar7 = 0;
    uVar4 = 0;
    local_40 = count;
    do {
      puVar2 = (local_38->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      if (puVar2 == (unsigned_long *)0x0) {
        uVar10 = 0xffffffffffffffff;
      }
      else {
        uVar10 = puVar2[uVar7];
      }
      uVar12 = uVar4 + 0x40;
      if (local_40 <= uVar4 + 0x40) {
        uVar12 = local_40;
      }
      uVar9 = uVar12;
      if (uVar10 != 0) {
        uVar9 = uVar4;
        if (uVar10 == 0xffffffffffffffff) {
          if (uVar4 < uVar12) {
            uVar4 = uVar4 << 4 | 8;
            do {
              puVar1 = (undefined8 *)((long)ldata + (uVar4 - 8));
              local_50._0_8_ = *puVar1;
              local_50.pointer.ptr = (char *)puVar1[1];
              puVar1 = (undefined8 *)((long)rdata + (uVar4 - 8));
              local_60._0_8_ = *puVar1;
              local_60.pointer.ptr = (char *)puVar1[1];
              bVar3 = string_t::StringComparisonOperators::GreaterThan
                                ((string_t *)&local_50.pointer,(string_t *)&local_60.pointer);
              result_data[uVar9] = bVar3;
              uVar9 = uVar9 + 1;
              uVar4 = uVar4 + 0x10;
            } while (uVar12 != uVar9);
          }
        }
        else if (uVar4 < uVar12) {
          uVar5 = uVar4 << 4 | 8;
          uVar8 = 0;
          do {
            if ((uVar10 >> (uVar8 & 0x3f) & 1) != 0) {
              puVar1 = (undefined8 *)((long)ldata + (uVar5 - 8));
              local_50._0_8_ = *puVar1;
              local_50.pointer.ptr = (char *)puVar1[1];
              puVar1 = (undefined8 *)((long)rdata + (uVar5 - 8));
              local_60._0_8_ = *puVar1;
              local_60.pointer.ptr = (char *)puVar1[1];
              bVar3 = string_t::StringComparisonOperators::GreaterThan
                                ((string_t *)&local_50.pointer,(string_t *)&local_60.pointer);
              result_data[uVar4] = bVar3;
            }
            uVar4 = uVar4 + 1;
            uVar5 = uVar5 + 0x10;
            uVar8 = uVar8 + 1;
            uVar9 = uVar4;
          } while (uVar12 != uVar4);
        }
      }
      uVar7 = uVar7 + 1;
      uVar4 = uVar9;
    } while (uVar7 != count + 0x3f >> 6);
  }
  return;
}

Assistant:

static void ExecuteFlatLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                            RESULT_TYPE *__restrict result_data, idx_t count, ValidityMask &mask, FUNC fun) {
		if (!LEFT_CONSTANT) {
			ASSERT_RESTRICT(ldata, ldata + count, result_data, result_data + count);
		}
		if (!RIGHT_CONSTANT) {
			ASSERT_RESTRICT(rdata, rdata + count, result_data, result_data + count);
		}

		if (!mask.AllValid()) {
			idx_t base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
						auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
						result_data[base_idx] =
						    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
						        fun, lentry, rentry, mask, base_idx);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
							auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
							result_data[base_idx] =
							    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
							        fun, lentry, rentry, mask, base_idx);
						}
					}
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto lentry = ldata[LEFT_CONSTANT ? 0 : i];
				auto rentry = rdata[RIGHT_CONSTANT ? 0 : i];
				result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
				    fun, lentry, rentry, mask, i);
			}
		}
	}